

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

int __thiscall Imf_3_4::TiledInputFile::numYTiles(TiledInputFile *this,int ly)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *this_00;
  int32_t county;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  iVar1 = exr_get_tile_counts(*(this->_ctxt)._ctxt.
                               super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,((this->_data).
                                        super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->partNumber,0,ly,0);
  if (iVar1 == 0) {
    return 0;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_188,"Error calling numYTiles() on image file \"");
  pcVar3 = Context::fileName(&this->_ctxt);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

int
TiledInputFile::numYTiles (int ly) const
{
    int32_t county = 0;
    if (EXR_ERR_SUCCESS != exr_get_tile_counts (
            _ctxt, _data->partNumber, 0, ly, nullptr, &county))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error calling numYTiles() on image "
            "file \""
                << fileName () << "\".");
    }
    return county;
}